

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::SyncMetaData
          (CWallet *this,
          pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
          range)

{
  CWalletTx *_tx;
  long lVar1;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> _Var5;
  int iVar6;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var7;
  CWalletTx *this_00;
  __hashtable *__h;
  __hashtable *__h_1;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var8;
  iterator it;
  long in_FS_OFFSET;
  
  _Var5 = range.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
  _Var7._M_cur = (__node_type *)
                 range.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                 _M_cur;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var7._M_cur ==
      _Var5.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur) {
    this_00 = (CWalletTx *)0x0;
  }
  else {
    iVar6 = 0x7fffffff;
    this_00 = (CWalletTx *)0x0;
    _Var8._M_cur = _Var7._M_cur;
    do {
      iVar4 = std::
              _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->mapWallet)._M_h,
                     (key_type *)
                     ((long)&((_Var8._M_cur)->
                             super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                             super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                             _M_storage._M_storage + 0x24));
      if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
          == (__node_type *)0x0) goto LAB_00c29da6;
      lVar2 = *(long *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x80);
      if (lVar2 < iVar6) {
        this_00 = (CWalletTx *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                         ._M_cur + 0x28);
      }
      if (lVar2 < iVar6) {
        iVar6 = (int)lVar2;
      }
      _Var8._M_cur = (__node_type *)((_Var8._M_cur)->super__Hash_node_base)._M_nxt;
    } while ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var8._M_cur !=
             _Var5.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur);
  }
  if ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var7._M_cur !=
      _Var5.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur &&
      this_00 != (CWalletTx *)0x0) {
    do {
      iVar4 = std::
              _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->mapWallet)._M_h,
                     (key_type *)
                     ((long)&((_Var7._M_cur)->
                             super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                             super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                             _M_storage._M_storage + 0x24));
      if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
          == (__node_type *)0x0) goto LAB_00c29da6;
      _tx = (CWalletTx *)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                   _M_cur + 0x28);
      if ((this_00 != _tx) && (bVar3 = CWalletTx::IsEquivalentTo(this_00,_tx), bVar3)) {
        _GLOBAL__N_1::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)_tx,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00);
        _GLOBAL__N_1::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x58),
                    (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&this_00->vOrderForm);
        *(uint *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x78) = this_00->nTimeSmart;
        *(bool *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x7c) = this_00->fFromMe;
      }
      _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt;
    } while ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var7._M_cur !=
             _Var5.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00c29dc2:
  __stack_chk_fail();
LAB_00c29da6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_out_of_range("_Map_base::at");
  }
  goto LAB_00c29dc2;
}

Assistant:

void CWallet::SyncMetaData(std::pair<TxSpends::iterator, TxSpends::iterator> range)
{
    // We want all the wallet transactions in range to have the same metadata as
    // the oldest (smallest nOrderPos).
    // So: find smallest nOrderPos:

    int nMinOrderPos = std::numeric_limits<int>::max();
    const CWalletTx* copyFrom = nullptr;
    for (TxSpends::iterator it = range.first; it != range.second; ++it) {
        const CWalletTx* wtx = &mapWallet.at(it->second);
        if (wtx->nOrderPos < nMinOrderPos) {
            nMinOrderPos = wtx->nOrderPos;
            copyFrom = wtx;
        }
    }

    if (!copyFrom) {
        return;
    }

    // Now copy data from copyFrom to rest:
    for (TxSpends::iterator it = range.first; it != range.second; ++it)
    {
        const uint256& hash = it->second;
        CWalletTx* copyTo = &mapWallet.at(hash);
        if (copyFrom == copyTo) continue;
        assert(copyFrom && "Oldest wallet transaction in range assumed to have been found.");
        if (!copyFrom->IsEquivalentTo(*copyTo)) continue;
        copyTo->mapValue = copyFrom->mapValue;
        copyTo->vOrderForm = copyFrom->vOrderForm;
        // fTimeReceivedIsTxTime not copied on purpose
        // nTimeReceived not copied on purpose
        copyTo->nTimeSmart = copyFrom->nTimeSmart;
        copyTo->fFromMe = copyFrom->fFromMe;
        // nOrderPos not copied on purpose
        // cached members not copied on purpose
    }
}